

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_0::Flatten
               (Descriptor *descriptor,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *flatten)

{
  int iVar1;
  Descriptor *in_RSI;
  Descriptor *in_RDI;
  int i;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *unaff_retaddr;
  int iVar2;
  int index;
  
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = Descriptor::nested_type_count(in_RDI);
    if (iVar1 <= iVar2) break;
    Descriptor::nested_type(in_RDI,index);
    Flatten(in_RSI,(vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)CONCAT44(index,iVar2));
    iVar2 = index + 1;
  }
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(unaff_retaddr,(value_type *)in_RDI);
  return;
}

Assistant:

void Flatten(const Descriptor* descriptor,
             std::vector<const Descriptor*>* flatten) {
  for (int i = 0; i < descriptor->nested_type_count(); i++)
    Flatten(descriptor->nested_type(i), flatten);
  flatten->push_back(descriptor);
}